

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O3

int nn_xbus_add(nn_sockbase *self,nn_pipe *pipe)

{
  int extraout_EAX;
  nn_dist_data *pnVar1;
  nn_pipe *self_00;
  nn_pipe *pnVar2;
  int rcvprio;
  size_t sz;
  int local_24;
  size_t local_20;
  
  local_20 = 4;
  self_00 = (nn_pipe *)0x0;
  pnVar2 = pipe;
  nn_pipe_getopt(pipe,0,9,&local_24,&local_20);
  if (local_20 == 4) {
    if (0xffffffef < local_24 - 0x11U) {
      pnVar2 = (nn_pipe *)0x38;
      pnVar1 = (nn_dist_data *)nn_alloc_(0x38);
      if (pnVar1 != (nn_dist_data *)0x0) {
        nn_fq_add((nn_fq *)&self[2].sock,(nn_fq_data *)(pnVar1 + 1),pipe,local_24);
        nn_dist_add((nn_dist *)(self + 1),pnVar1,pipe);
        nn_pipe_setdata(pipe,pnVar1);
        return 0;
      }
      goto LAB_00124afa;
    }
  }
  else {
    nn_xbus_add_cold_1();
  }
  nn_xbus_add_cold_3();
LAB_00124afa:
  nn_xbus_add_cold_2();
  pnVar1 = (nn_dist_data *)nn_pipe_getdata(self_00);
  nn_fq_rm((nn_fq *)(pnVar2 + 0x28),(nn_fq_data *)(pnVar1 + 1));
  nn_dist_rm((nn_dist *)(pnVar2 + 0x10),pnVar1);
  nn_free(pnVar1);
  return extraout_EAX;
}

Assistant:

int nn_xbus_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xbus *xbus;
    struct nn_xbus_data *data;
    int rcvprio;
    size_t sz;

    xbus = nn_cont (self, struct nn_xbus, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xbus_data), "pipe data (xbus)");
    alloc_assert (data);
    nn_fq_add (&xbus->inpipes, &data->initem, pipe, rcvprio);
    nn_dist_add (&xbus->outpipes, &data->outitem, pipe);
    nn_pipe_setdata (pipe, data);

    return 0;
}